

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  cmsysProcess *cp_00;
  char **command_00;
  ulong uVar5;
  char *pcVar6;
  ostream *poVar7;
  rep timeout_00;
  char *error_str_1;
  char *error_str;
  char *exception_str;
  undefined1 local_1e0 [7];
  bool result;
  char *local_1c0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1b8;
  string local_1b0;
  char *local_190;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_188;
  string local_180;
  string local_160;
  char *local_140;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_138;
  const_iterator local_130;
  char *local_128;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  const_iterator local_118;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  string strdata;
  int iStack_dc;
  cmProcessOutput processOutput;
  int pipe;
  int length;
  char *data;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  cmsysProcess *cp;
  value_type local_90;
  reference local_88;
  string *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  OutputOption outputflag_local;
  char *dir_local;
  int *retVal_local;
  string *captureStdErr_local;
  string *captureStdOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  cmDuration timeout_local;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = outputflag;
  command_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(command);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,sVar4 + 1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(command);
  cmd = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(command);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&cmd), bVar2) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_90 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_90);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cp = (cmsysProcess *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,(value_type *)&cp);
  cp_00 = cmsysProcess_New();
  command_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  cmsysProcess_SetCommand(cp_00,command_00);
  cmsysProcess_SetWorkingDirectory(cp_00,dir);
  bVar2 = GetRunCommandHideConsole();
  if (bVar2) {
    cmsysProcess_SetOption(cp_00,0,1);
  }
  if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp_00,2,1);
    cmsysProcess_SetPipeShared(cp_00,3,1);
    captureStdErr_local = (string *)0x0;
    retVal_local = (int *)0x0;
  }
  else {
    captureStdErr_local = captureStdOut;
    if ((argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ == OUTPUT_MERGE) ||
       ((retVal_local = (int *)captureStdErr, captureStdErr != (string *)0x0 &&
        (captureStdErr == captureStdOut)))) {
      cmsysProcess_SetOption(cp_00,2,1);
      retVal_local = (int *)0x0;
    }
  }
  if (retVal_local != (int *)0x0 && (string *)retVal_local == captureStdErr_local) {
    __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSystemTools.cxx"
                  ,0x2fa,
                  "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, cmDuration, Encoding)"
                 );
  }
  timeout_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                         ((duration<double,_std::ratio<1L,_1L>_> *)&command_local);
  cmsysProcess_SetTimeout(cp_00,timeout_00);
  cmsysProcess_Execute(cp_00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&data);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),encoding,0x400);
  std::__cxx11::string::string((string *)local_108);
  if ((argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_PASSTHROUGH) &&
     (((captureStdErr_local != (string *)0x0 || (retVal_local != (int *)0x0)) ||
      (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE)))) {
    while (iVar3 = cmsysProcess_WaitForData
                             (cp_00,(char **)&pipe,&stack0xffffffffffffff24,(double *)0x0),
          0 < iVar3) {
      for (local_10c = 0; local_10c < iStack_dc; local_10c = local_10c + 1) {
        if (_pipe[local_10c] == '\0') {
          _pipe[local_10c] = ' ';
        }
      }
      if (iVar3 == 2) {
        if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_pipe,(long)iStack_dc,
                     (string *)local_108,1);
          Stdout((string *)local_108);
        }
        if (captureStdErr_local != (string *)0x0) {
          puVar1 = &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
          local_120._M_current =
               (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_118,&local_120);
          local_128 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                        ((vector<char,std::allocator<char>> *)puVar1,local_118,_pipe
                                         ,_pipe + iStack_dc);
        }
      }
      else if (iVar3 == 3) {
        if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_pipe,(long)iStack_dc,
                     (string *)local_108,2);
          Stderr((string *)local_108);
        }
        if (retVal_local != (int *)0x0) {
          local_138._M_current =
               (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)&data);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_130,&local_138);
          local_140 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                        ((vector<char,std::allocator<char>> *)&data,local_130,_pipe,
                                         _pipe + iStack_dc);
        }
      }
    }
    if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
      std::__cxx11::string::string((string *)&local_160);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_160,
                 (string *)local_108,1);
      std::__cxx11::string::~string((string *)&local_160);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        Stdout((string *)local_108);
      }
      std::__cxx11::string::string((string *)&local_180);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_180,
                 (string *)local_108,2);
      std::__cxx11::string::~string((string *)&local_180);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        Stderr((string *)local_108);
      }
    }
  }
  cmsysProcess_WaitForExit(cp_00,(double *)0x0);
  if (captureStdErr_local != (string *)0x0) {
    puVar1 = &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    local_188._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)puVar1);
    local_190 = (char *)std::vector<char,_std::allocator<char>_>::end
                                  ((vector<char,_std::allocator<char>_> *)puVar1);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr_local,local_188,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_190);
    std::__cxx11::string::string((string *)&local_1b0,(string *)captureStdErr_local);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_1b0,
               captureStdErr_local,0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  if (retVal_local != (int *)0x0) {
    local_1b8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)&data);
    local_1c0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                  ((vector<char,_std::allocator<char>_> *)&data);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)retVal_local,local_1b8,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1c0);
    std::__cxx11::string::string((string *)local_1e0,(string *)retVal_local);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)local_1e0,
               (string *)retVal_local,0);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  exception_str._7_1_ = true;
  iVar3 = cmsysProcess_GetState(cp_00);
  if (iVar3 == 4) {
    if (retVal == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      exception_str._7_1_ = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar3;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp_00);
    if (iVar3 == 2) {
      pcVar6 = cmsysProcess_GetExceptionString(cp_00);
      if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if (retVal_local == (int *)0x0) {
        if (captureStdErr_local != (string *)0x0) {
          strlen(pcVar6);
          std::__cxx11::string::append((char *)captureStdErr_local,(ulong)pcVar6);
        }
      }
      else {
        strlen(pcVar6);
        std::__cxx11::string::append((char *)retVal_local,(ulong)pcVar6);
      }
      exception_str._7_1_ = false;
    }
    else {
      iVar3 = cmsysProcess_GetState(cp_00);
      if (iVar3 == 1) {
        pcVar6 = cmsysProcess_GetErrorString(cp_00);
        if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
          poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        if (retVal_local == (int *)0x0) {
          if (captureStdErr_local != (string *)0x0) {
            strlen(pcVar6);
            std::__cxx11::string::append((char *)captureStdErr_local,(ulong)pcVar6);
          }
        }
        else {
          strlen(pcVar6);
          std::__cxx11::string::append((char *)retVal_local,(ulong)pcVar6);
        }
        exception_str._7_1_ = false;
      }
      else {
        iVar3 = cmsysProcess_GetState(cp_00);
        if (iVar3 == 5) {
          if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ != OUTPUT_NONE) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          if (retVal_local != (int *)0x0) {
            strlen("Process terminated due to timeout\n");
            std::__cxx11::string::append((char *)retVal_local,0x25f349);
          }
          exception_str._7_1_ = false;
        }
      }
    }
  }
  cmsysProcess_Delete(cp_00);
  std::__cxx11::string::~string((string *)local_108);
  cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf));
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&data);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  return exception_str._7_1_;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(command.size() + 1);
  for (std::string const& cmd : command) {
    argv.push_back(cmd.c_str());
  }
  argv.push_back(nullptr);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = nullptr;
    captureStdErr = nullptr;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = nullptr;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata);
        }
        if (captureStdOut) {
          tempStdOut.insert(tempStdOut.end(), data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata);
        }
        if (captureStdErr) {
          tempStdErr.insert(tempStdErr.end(), data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata);
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata);
      }
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    } else if (captureStdOut) {
      captureStdOut->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    } else if (captureStdOut) {
      captureStdOut->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}